

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::CommandReporter::assembleFullCommand
          (string *__return_storage_ptr__,CommandReporter *this,string *received,string *approved)

{
  element_type *peVar1;
  string args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> convertedApproved;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> convertedReceived;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> convertedCommand;
  
  peVar1 = (this->converter).
           super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_ConvertForCygwin[2])(&convertedApproved,peVar1,&this->cmd);
  ::std::operator+(&convertedReceived,'\"',&convertedApproved);
  ::std::operator+(&convertedCommand,&convertedReceived,'\"');
  ::std::__cxx11::string::~string((string *)&convertedReceived);
  ::std::__cxx11::string::~string((string *)&convertedApproved);
  peVar1 = (this->converter).
           super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_ConvertForCygwin[3])(&args,peVar1,received);
  ::std::operator+(&convertedApproved,'\"',&args);
  ::std::operator+(&convertedReceived,&convertedApproved,'\"');
  ::std::__cxx11::string::~string((string *)&convertedApproved);
  ::std::__cxx11::string::~string((string *)&args);
  peVar1 = (this->converter).
           super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_ConvertForCygwin[3])(&local_108,peVar1,approved);
  ::std::operator+(&args,'\"',&local_108);
  ::std::operator+(&convertedApproved,&args,'\"');
  ::std::__cxx11::string::~string((string *)&args);
  ::std::__cxx11::string::~string((string *)&local_108);
  args._M_dataplus._M_p = (pointer)&args.field_2;
  args._M_string_length = 0;
  args.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string((string *)&local_68,(string *)&this->arguments);
  DiffInfo::receivedFileTemplate_abi_cxx11_();
  StringUtils::replaceAll((string *)&local_108,&local_68,&local_c8,(string *)&convertedReceived);
  ::std::__cxx11::string::operator=((string *)&args,(string *)&local_108);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::string((string *)&local_88,(string *)&args);
  DiffInfo::approvedFileTemplate_abi_cxx11_();
  StringUtils::replaceAll((string *)&local_108,&local_88,&local_c8,(string *)&convertedApproved);
  ::std::__cxx11::string::operator=((string *)&args,(string *)&local_108);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::__cxx11::string::~string((string *)&local_c8);
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::operator+(&local_108,&convertedCommand,' ');
  ::std::operator+(__return_storage_ptr__,&local_108,&args);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::__cxx11::string::~string((string *)&args);
  ::std::__cxx11::string::~string((string *)&convertedApproved);
  ::std::__cxx11::string::~string((string *)&convertedReceived);
  ::std::__cxx11::string::~string((string *)&convertedCommand);
  return __return_storage_ptr__;
}

Assistant:

std::string CommandReporter::assembleFullCommand(const std::string& received,
                                                     const std::string& approved) const
    {
        auto convertedCommand = '"' + converter->convertProgramForCygwin(cmd) + '"';
        auto convertedReceived =
            '"' + converter->convertFileArgumentForCygwin(received) + '"';
        auto convertedApproved =
            '"' + converter->convertFileArgumentForCygwin(approved) + '"';

        std::string args;
        args = StringUtils::replaceAll(
            arguments, DiffInfo::receivedFileTemplate(), convertedReceived);
        args = StringUtils::replaceAll(
            args, DiffInfo::approvedFileTemplate(), convertedApproved);

        return convertedCommand + ' ' + args;
    }